

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t uloc_getKeywordValue_63
                  (char *localeID,char *keywordName,char *buffer,int32_t bufferCapacity,
                  UErrorCode *status)

{
  char *pcVar1;
  UBool UVar2;
  char cVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  char localeKeywordNameBuffer [25];
  char keywordNameBuffer [25];
  char tempBuffer [157];
  
  if (status == (UErrorCode *)0x0) {
    return 0;
  }
  if (localeID == (char *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if ((keywordName != (char *)0x0) && (*keywordName != '\0')) {
    locale_canonKeywordName(keywordNameBuffer,keywordName,status);
    if (U_ZERO_ERROR < *status) {
      return 0;
    }
    pcVar7 = strchr(localeID,0x40);
    pcVar8 = localeID;
    if ((pcVar7 == (char *)0x0) && (iVar4 = getShortestSubtagLength(localeID), iVar4 == 1)) {
      iVar4 = uloc_forLanguageTag_63(localeID,tempBuffer,0x9d,(int32_t *)0x0,status);
      pcVar7 = localeID;
      if (((iVar4 < 1) || (pcVar7 = tempBuffer, *status < U_ILLEGAL_ARGUMENT_ERROR)) &&
         (pcVar8 = pcVar7, *status == U_STRING_NOT_TERMINATED_WARNING)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
        pcVar8 = localeID;
      }
    }
    pcVar8 = locale_getKeywordsStart_63(pcVar8);
    if (pcVar8 == (char *)0x0) {
      return 0;
    }
    do {
      if (pcVar8 == (char *)0x0) {
        return 0;
      }
      pcVar7 = strchr(pcVar8 + 1,0x3d);
      if (pcVar7 == (char *)0x0) goto LAB_0029dbff;
      do {
        pcVar10 = pcVar8 + 1;
        pcVar8 = pcVar8 + 1;
        pcVar1 = pcVar7;
      } while (*pcVar10 == ' ');
      do {
        pcVar10 = pcVar1;
        if (pcVar10 <= pcVar8) break;
        pcVar1 = pcVar10 + -1;
      } while (pcVar10[-1] == ' ');
      if (pcVar10 == pcVar8) goto LAB_0029dbff;
      for (lVar11 = 0; pcVar8 + lVar11 < pcVar10; lVar11 = lVar11 + 1) {
        UVar2 = uprv_isASCIILetter_63(pcVar8[lVar11]);
        if ((UVar2 == '\0') && (9 < (byte)(pcVar8[lVar11] - 0x30U))) goto LAB_0029dbff;
        if (lVar11 == 0x18) {
          *status = U_INTERNAL_PROGRAM_ERROR;
          return 0;
        }
        cVar3 = uprv_asciitolower_63(pcVar8[lVar11]);
        localeKeywordNameBuffer[lVar11] = cVar3;
      }
      localeKeywordNameBuffer[lVar11] = '\0';
      pcVar8 = strchr(pcVar7,0x3b);
      iVar5 = strcmp(keywordNameBuffer,localeKeywordNameBuffer);
    } while (iVar5 != 0);
    do {
      pcVar10 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
    } while (*pcVar10 == ' ');
    if (pcVar8 == (char *)0x0) {
      sVar9 = strlen(pcVar7);
      pcVar8 = pcVar7 + sVar9;
    }
    do {
      pcVar10 = pcVar8;
      if (pcVar10 <= pcVar7) break;
      pcVar8 = pcVar10 + -1;
    } while (pcVar10[-1] == ' ');
    if (pcVar7 != pcVar10) {
      lVar11 = 0;
      while( true ) {
        if (pcVar10 <= pcVar7 + lVar11) {
          iVar4 = u_terminateChars_63(buffer,bufferCapacity,(int32_t)lVar11,status);
          return iVar4;
        }
        UVar2 = uprv_isASCIILetter_63(pcVar7[lVar11]);
        if (((UVar2 == '\0') && (9 < (byte)(pcVar7[lVar11] - 0x30U))) &&
           ((uVar6 = (byte)pcVar7[lVar11] - 0x2b, 0x34 < uVar6 ||
            ((0x10000000000015U >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) break;
        if (lVar11 < bufferCapacity) {
          buffer[lVar11] = pcVar7[lVar11];
        }
        lVar11 = lVar11 + 1;
      }
    }
  }
LAB_0029dbff:
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getKeywordValue(const char* localeID,
                     const char* keywordName,
                     char* buffer, int32_t bufferCapacity,
                     UErrorCode* status)
{
    const char* startSearchHere = NULL;
    const char* nextSeparator = NULL;
    char keywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    char localeKeywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    int32_t result = 0;

    if(status && U_SUCCESS(*status) && localeID) {
      char tempBuffer[ULOC_FULLNAME_CAPACITY];
      const char* tmpLocaleID;

      if (keywordName == NULL || keywordName[0] == 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
      }

      locale_canonKeywordName(keywordNameBuffer, keywordName, status);
      if(U_FAILURE(*status)) {
        return 0;
      }

      if (_hasBCP47Extension(localeID)) {
          _ConvertBCP47(tmpLocaleID, localeID, tempBuffer, sizeof(tempBuffer), status);
      } else {
          tmpLocaleID=localeID;
      }

      startSearchHere = locale_getKeywordsStart(tmpLocaleID);
      if(startSearchHere == NULL) {
          /* no keywords, return at once */
          return 0;
      }

      /* find the first keyword */
      while(startSearchHere) {
          const char* keyValueTail;
          int32_t keyValueLen;

          startSearchHere++; /* skip @ or ; */
          nextSeparator = uprv_strchr(startSearchHere, '=');
          if(!nextSeparator) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* key must have =value */
              return 0;
          }
          /* strip leading & trailing spaces (TC decided to tolerate these) */
          while(*startSearchHere == ' ') {
              startSearchHere++;
          }
          keyValueTail = nextSeparator;
          while (keyValueTail > startSearchHere && *(keyValueTail-1) == ' ') {
              keyValueTail--;
          }
          /* now keyValueTail points to first char after the keyName */
          /* copy & normalize keyName from locale */
          if (startSearchHere == keyValueTail) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name in passed-in locale */
              return 0;
          }
          keyValueLen = 0;
          while (startSearchHere < keyValueTail) {
            if (!UPRV_ISALPHANUM(*startSearchHere)) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
              return 0;
            }
            if (keyValueLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
              localeKeywordNameBuffer[keyValueLen++] = uprv_tolower(*startSearchHere++);
            } else {
              /* keyword name too long for internal buffer */
              *status = U_INTERNAL_PROGRAM_ERROR;
              return 0;
            }
          }
          localeKeywordNameBuffer[keyValueLen] = 0; /* terminate */

          startSearchHere = uprv_strchr(nextSeparator, ';');

          if(uprv_strcmp(keywordNameBuffer, localeKeywordNameBuffer) == 0) {
               /* current entry matches the keyword. */
             nextSeparator++; /* skip '=' */
              /* First strip leading & trailing spaces (TC decided to tolerate these) */
              while(*nextSeparator == ' ') {
                nextSeparator++;
              }
              keyValueTail = (startSearchHere)? startSearchHere: nextSeparator + uprv_strlen(nextSeparator);
              while(keyValueTail > nextSeparator && *(keyValueTail-1) == ' ') {
                keyValueTail--;
              }
              /* Now copy the value, but check well-formedness */
              if (nextSeparator == keyValueTail) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty key value name in passed-in locale */
                return 0;
              }
              keyValueLen = 0;
              while (nextSeparator < keyValueTail) {
                if (!UPRV_ISALPHANUM(*nextSeparator) && !UPRV_OK_VALUE_PUNCTUATION(*nextSeparator)) {
                  *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed key value */
                  return 0;
                }
                if (keyValueLen < bufferCapacity) {
                  /* Should we lowercase value to return here? Tests expect as-is. */
                  buffer[keyValueLen++] = *nextSeparator++;
                } else { /* keep advancing so we return correct length in case of overflow */
                  keyValueLen++;
                  nextSeparator++;
                }
              }
              result = u_terminateChars(buffer, bufferCapacity, keyValueLen, status);
              return result;
          }
      }
    }
    return 0;
}